

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

void * pybind11::polymorphic_type_hook<CoolProp::AbstractState,_void>::get
                 (AbstractState *src,type_info **type)

{
  AbstractState *local_38;
  type_info *local_28;
  type_info **type_local;
  AbstractState *src_local;
  
  if (src == (AbstractState *)0x0) {
    local_28 = (type_info *)0x0;
  }
  else {
    if (src == (AbstractState *)0x0) {
      __cxa_bad_typeid();
    }
    local_28 = *(type_info **)(*(long *)src + -8);
  }
  *type = local_28;
  if (src == (AbstractState *)0x0) {
    local_38 = (AbstractState *)0x0;
  }
  else {
    local_38 = src + *(long *)(*(long *)src + -0x10);
  }
  return local_38;
}

Assistant:

static const void *get(const itype *src, const std::type_info*& type) {
        type = src ? &typeid(*src) : nullptr;
        return dynamic_cast<const void*>(src);
    }